

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

void __thiscall
brynet::net::AsyncConnector::asyncConnect
          (AsyncConnector *this,string *ip,int port,nanoseconds timeout,
          COMPLETED_CALLBACK *successCB,FAILED_CALLBACK *failedCB)

{
  COMPLETED_CALLBACK *__x;
  FAILED_CALLBACK *__x_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  EventLoop *this_01;
  runtime_error *this_02;
  AsyncConnectAddr address;
  undefined1 *local_138;
  undefined8 local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  undefined8 uStack_120;
  int local_118;
  undefined4 uStack_114;
  rep rStack_110;
  _Any_data local_108;
  code *local_f8;
  undefined8 uStack_f0;
  _Any_data local_e8;
  code *local_d8;
  undefined8 uStack_d0;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  AsyncConnectAddr local_a0;
  
  std::__shared_mutex_pthread::lock_shared(&(this->mThreadGuard)._M_impl);
  if (((successCB->super__Function_base)._M_manager == (_Manager_type)0x0) ||
     ((failedCB->super__Function_base)._M_manager == (_Manager_type)0x0)) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"all callback is nullptr");
  }
  else {
    if (*(this->mIsRun).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr != false) {
      peVar1 = (this->mWorkInfo).
               super___shared_ptr<brynet::net::ConnectorWorkInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      this_00 = (this->mWorkInfo).
                super___shared_ptr<brynet::net::ConnectorWorkInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      AsyncConnectAddr::AsyncConnectAddr(&local_a0,ip,port,timeout,successCB,failedCB);
      this_01 = (this->mEventLoop).
                super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_138 = &local_128;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_a0.mIP._M_dataplus._M_p,
                 local_a0.mIP._M_dataplus._M_p + local_a0.mIP._M_string_length);
      __x = &local_a0.mSuccessCB;
      local_118 = local_a0.mPort;
      uStack_114 = local_a0._36_4_;
      rStack_110 = local_a0.mTimeout.__r;
      std::
      function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
      ::function((function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
                  *)&local_108,__x);
      __x_00 = &local_a0.mFailedCB;
      std::function<void_()>::function((function<void_()> *)&local_e8,__x_00);
      local_b8 = (code *)0x0;
      pcStack_b0 = (code *)0x0;
      local_c8._M_unused._M_object = (void *)0x0;
      local_c8._8_8_ = 0;
      local_c8._M_unused._M_object = operator_new(0x80);
      *(element_type **)local_c8._M_unused._0_8_ = peVar1;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_c8._M_unused._0_8_ + 8) =
           this_00;
      *(code **)((long)local_c8._M_unused._0_8_ + 0x10) =
           (code *)((long)local_c8._M_unused._0_8_ + 0x20);
      if (local_138 == &local_128) {
        *(ulong *)((long)local_c8._M_unused._0_8_ + 0x20) = CONCAT71(uStack_127,local_128);
        *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x28) = uStack_120;
      }
      else {
        *(undefined1 **)((long)local_c8._M_unused._0_8_ + 0x10) = local_138;
        *(ulong *)((long)local_c8._M_unused._0_8_ + 0x20) = CONCAT71(uStack_127,local_128);
      }
      *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x18) = local_130;
      local_130 = 0;
      local_128 = 0;
      *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x30) = _local_118;
      *(rep *)((long)local_c8._M_unused._0_8_ + 0x38) = rStack_110;
      *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x40) = 0;
      *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x48) = 0;
      *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x50) = 0;
      *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x58) = uStack_f0;
      if (local_f8 != (code *)0x0) {
        *(void **)((long)local_c8._M_unused._0_8_ + 0x40) = local_108._M_unused._M_object;
        *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x48) = local_108._8_8_;
        *(code **)((long)local_c8._M_unused._0_8_ + 0x50) = local_f8;
        local_f8 = (code *)0x0;
        uStack_f0 = 0;
      }
      *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x60) = 0;
      *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x68) = 0;
      *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x70) = 0;
      *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x78) = uStack_d0;
      if (local_d8 != (code *)0x0) {
        *(void **)((long)local_c8._M_unused._0_8_ + 0x60) = local_e8._M_unused._M_object;
        *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x68) = local_e8._8_8_;
        *(code **)((long)local_c8._M_unused._0_8_ + 0x70) = local_d8;
        local_d8 = (code *)0x0;
        uStack_d0 = 0;
      }
      pcStack_b0 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/Connector.cpp:421:31)>
                   ::_M_invoke;
      local_b8 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/Connector.cpp:421:31)>
                 ::_M_manager;
      local_138 = &local_128;
      EventLoop::pushAsyncProc(this_01,(USER_PROC *)&local_c8);
      if (local_b8 != (code *)0x0) {
        (*local_b8)(&local_c8,&local_c8,__destroy_functor);
      }
      if (local_d8 != (code *)0x0) {
        (*local_d8)(&local_e8,&local_e8,__destroy_functor);
      }
      if (local_f8 != (code *)0x0) {
        (*local_f8)(&local_108,&local_108,__destroy_functor);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
      }
      if (local_a0.mFailedCB.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_a0.mFailedCB.super__Function_base._M_manager)
                  ((_Any_data *)__x_00,(_Any_data *)__x_00,__destroy_functor);
      }
      if (local_a0.mSuccessCB.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_a0.mSuccessCB.super__Function_base._M_manager)
                  ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.mIP._M_dataplus._M_p != &local_a0.mIP.field_2) {
        operator_delete(local_a0.mIP._M_dataplus._M_p,local_a0.mIP.field_2._M_allocated_capacity + 1
                       );
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)&this->mThreadGuard);
      return;
    }
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"work thread already stop");
  }
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AsyncConnector::asyncConnect(const std::string& ip, 
    int port, 
    std::chrono::nanoseconds timeout,
    COMPLETED_CALLBACK successCB, 
    FAILED_CALLBACK failedCB)
{
#ifdef HAVE_LANG_CXX17
    std::shared_lock<std::shared_mutex> lck(mThreadGuard);
#else
    std::lock_guard<std::mutex> lck(mThreadGuard);
#endif

    if (successCB == nullptr || failedCB == nullptr)
    {
        throw std::runtime_error("all callback is nullptr");
    }

    if (!(*mIsRun))
    {
        throw std::runtime_error("work thread already stop");
    }

    auto workInfo = mWorkInfo;
    auto address = AsyncConnectAddr(ip,
        port,
        timeout,
        successCB,
        failedCB);
    mEventLoop->pushAsyncProc([workInfo, address]() {
        workInfo->processConnect(address);
    });
}